

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O2

void Js::CrossSite::MarshalPrototypeChain(ScriptContext *scriptContext,DynamicObject *object)

{
  Type TVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  RecyclableObject *obj;
  
  do {
    obj = RecyclableObject::GetPrototype(&object->super_RecyclableObject);
    TVar1 = ((obj->type).ptr)->typeId;
    if (TVar1 == TypeIds_Null) {
      return;
    }
    if (TVar1 == TypeIds_HostDispatch) {
      return;
    }
    object = VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
    iVar3 = (*(object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x66])(object);
    if (iVar3 != 0) {
      return;
    }
    if (((((((object->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr != scriptContext) &&
       (BVar4 = RecyclableObject::IsExternal(&object->super_RecyclableObject), BVar4 == 0)) {
      MarshalDynamicObject(scriptContext,object);
    }
    bVar2 = VarIsImpl<Js::JavascriptProxy>(&object->super_RecyclableObject);
  } while (!bVar2);
  return;
}

Assistant:

void CrossSite::MarshalPrototypeChain(ScriptContext* scriptContext, DynamicObject * object)
    {
        RecyclableObject * prototype = object->GetPrototype();
        while (prototype->GetTypeId() != TypeIds_Null && prototype->GetTypeId() != TypeIds_HostDispatch)
        {
            // We should not see any static type or host dispatch here
            DynamicObject * prototypeObject = VarTo<DynamicObject>(prototype);
            if (prototypeObject->IsCrossSiteObject())
            {
                break;
            }
            if (scriptContext != prototypeObject->GetScriptContext() && !prototypeObject->IsExternal())
            {
                MarshalDynamicObject(scriptContext, prototypeObject);
            }
            if (VarIs<JavascriptProxy>(prototypeObject))
            {
                // Fetching prototype of proxy can invoke trap - which we don't want during the marshalling time.
                break;
            }
            prototype = prototypeObject->GetPrototype();
        }
    }